

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbstrmatrix.cpp
# Opt level: O2

TPZStructMatrix * __thiscall
TPZSBandStructMatrix<double,_TPZStructMatrixOR<double>_>::Clone
          (TPZSBandStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xb8);
  TPZSBandStructMatrix((TPZSBandStructMatrix<double,_TPZStructMatrixOR<double>_> *)this_00,this);
  return this_00;
}

Assistant:

TPZStructMatrix * TPZSBandStructMatrix<TVar,TPar>::Clone(){
    return new TPZSBandStructMatrix(*this);
}